

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall testing::KilledBySignal::operator()(KilledBySignal *this,int exit_status)

{
  bool local_15;
  int exit_status_local;
  KilledBySignal *this_local;
  
  local_15 = false;
  if ('\0' < (char)(((byte)exit_status & 0x7f) + 1) >> 1) {
    local_15 = (exit_status & 0x7fU) == this->signum_;
  }
  return local_15;
}

Assistant:

bool KilledBySignal::operator()(int exit_status) const {
#  if defined(GTEST_KILLED_BY_SIGNAL_OVERRIDE_)
  {
    bool result;
    if (GTEST_KILLED_BY_SIGNAL_OVERRIDE_(signum_, exit_status, &result)) {
      return result;
    }
  }
#  endif  // defined(GTEST_KILLED_BY_SIGNAL_OVERRIDE_)
  return WIFSIGNALED(exit_status) && WTERMSIG(exit_status) == signum_;
}